

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O2

EvaluationResult wasm::GCTypeUtils::flipEvaluationResult(EvaluationResult result)

{
  if (result < (SuccessOnlyIfNonNull|Failure)) {
    return *(EvaluationResult *)(&DAT_00e2ef60 + (ulong)result * 4);
  }
  handle_unreachable("unexpected result",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                     ,0x41);
}

Assistant:

inline EvaluationResult flipEvaluationResult(EvaluationResult result) {
  switch (result) {
    case Unknown:
      return Unknown;
    case Success:
      return Failure;
    case Failure:
      return Success;
    case SuccessOnlyIfNull:
      return SuccessOnlyIfNonNull;
    case SuccessOnlyIfNonNull:
      return SuccessOnlyIfNull;
    case Unreachable:
      return Unreachable;
  }
  WASM_UNREACHABLE("unexpected result");
}